

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run.c
# Opt level: O3

void run_container_union(run_container_t *src_1,run_container_t *src_2,run_container_t *dst)

{
  ushort uVar1;
  rle16_t rVar2;
  rle16_t rVar3;
  rle16_t *prVar4;
  ulong uVar5;
  ushort uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  rle16_t *prVar12;
  uint16_t uVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  bool bVar17;
  
  prVar4 = src_1->runs;
  uVar6 = prVar4->value;
  if (uVar6 == 0 && src_1->n_runs == 1) {
    bVar16 = prVar4->length == 0xffff;
  }
  else {
    bVar16 = false;
  }
  prVar12 = src_2->runs;
  uVar13 = prVar12->value;
  if (uVar13 == 0 && src_2->n_runs == 1) {
    bVar17 = prVar12->length == 0xffff;
  }
  else {
    bVar17 = false;
  }
  if ((bool)(bVar17 | bVar16)) {
    if (bVar16) {
      src_2 = src_1;
    }
    run_container_copy(src_2,dst);
    return;
  }
  iVar8 = src_2->n_runs + src_1->n_runs;
  if (dst->capacity < iVar8) {
    run_container_grow(dst,iVar8,false);
    prVar4 = src_1->runs;
    uVar6 = prVar4->value;
    prVar12 = src_2->runs;
    uVar13 = prVar12->value;
  }
  uVar5 = (ulong)(uVar6 <= uVar13);
  uVar15 = (uint)(uVar6 <= uVar13);
  dst->n_runs = 0;
  uVar10 = (ulong)(uVar13 < uVar6);
  uVar9 = (uint)(uVar13 < uVar6);
  if (uVar6 <= uVar13) {
    prVar12 = prVar4;
  }
  rVar3 = *prVar12;
  *dst->runs = rVar3;
  dst->n_runs = dst->n_runs + 1;
  uVar7 = (uint)rVar3 >> 0x10;
  iVar8 = src_2->n_runs;
  if (((int)uVar9 < iVar8) && ((int)uVar15 < src_1->n_runs)) {
    do {
      uVar6 = src_1->runs[uVar5].value;
      uVar1 = src_2->runs[uVar10].value;
      prVar4 = src_1->runs + uVar5;
      if (uVar1 < uVar6) {
        prVar4 = src_2->runs + uVar10;
      }
      rVar2 = *prVar4;
      uVar15 = (uint)rVar3 & 0xffff;
      if (uVar15 + (uVar7 & 0xffff) + 1 < ((uint)rVar2 & 0xffff)) {
        prVar4 = dst->runs;
        iVar8 = dst->n_runs;
        prVar4[iVar8].value = rVar2.value;
        prVar4[iVar8].length = rVar2.length;
        dst->n_runs = iVar8 + 1;
        rVar3 = rVar2;
        uVar7 = (uint)rVar2 >> 0x10;
      }
      else {
        uVar9 = ((uint)rVar2 & 0xffff) + ((uint)rVar2 >> 0x10);
        if ((uVar7 & 0xffff) + uVar15 <= uVar9) {
          uVar7 = uVar9 - uVar15;
          dst->runs[(long)dst->n_runs + -1] = (rle16_t)(uVar7 * 0x10000 | uVar15);
        }
      }
      uVar9 = (int)uVar10 + (uint)(uVar1 < uVar6);
      uVar10 = (ulong)uVar9;
      uVar15 = (int)uVar5 + (uint)(uVar6 <= uVar1);
      uVar5 = (ulong)uVar15;
      iVar8 = src_2->n_runs;
    } while (((int)uVar9 < iVar8) && ((int)uVar15 < src_1->n_runs));
  }
  if ((int)uVar9 < iVar8) {
    lVar11 = (long)(int)uVar9;
    do {
      rVar2 = src_2->runs[lVar11];
      uVar9 = (uint)rVar3 & 0xffff;
      if (uVar9 + (uVar7 & 0xffff) + 1 < ((uint)rVar2 & 0xffff)) {
        prVar4 = dst->runs;
        iVar8 = dst->n_runs;
        prVar4[iVar8].value = rVar2.value;
        prVar4[iVar8].length = rVar2.length;
        dst->n_runs = iVar8 + 1;
        rVar3 = rVar2;
        uVar7 = (uint)rVar2 >> 0x10;
      }
      else {
        uVar14 = ((uint)rVar2 & 0xffff) + ((uint)rVar2 >> 0x10);
        if ((uVar7 & 0xffff) + uVar9 <= uVar14) {
          uVar7 = uVar14 - uVar9;
          dst->runs[(long)dst->n_runs + -1] = (rle16_t)(uVar7 * 0x10000 | uVar9);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < src_2->n_runs);
  }
  if ((int)uVar15 < src_1->n_runs) {
    lVar11 = (long)(int)uVar15;
    do {
      rVar2 = src_1->runs[lVar11];
      uVar15 = (uint)rVar3 & 0xffff;
      if (uVar15 + (uVar7 & 0xffff) + 1 < ((uint)rVar2 & 0xffff)) {
        prVar4 = dst->runs;
        iVar8 = dst->n_runs;
        prVar4[iVar8].value = rVar2.value;
        prVar4[iVar8].length = rVar2.length;
        dst->n_runs = iVar8 + 1;
        rVar3 = rVar2;
        uVar7 = (uint)rVar2 >> 0x10;
      }
      else {
        uVar9 = ((uint)rVar2 & 0xffff) + ((uint)rVar2 >> 0x10);
        if ((uVar7 & 0xffff) + uVar15 <= uVar9) {
          uVar7 = uVar9 - uVar15;
          dst->runs[(long)dst->n_runs + -1] = (rle16_t)(uVar7 * 0x10000 | uVar15);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < src_1->n_runs);
  }
  return;
}

Assistant:

void run_container_union(const run_container_t *src_1,
                         const run_container_t *src_2, run_container_t *dst) {
    // TODO: this could be a lot more efficient

    // we start out with inexpensive checks
    const bool if1 = run_container_is_full(src_1);
    const bool if2 = run_container_is_full(src_2);
    if (if1 || if2) {
        if (if1) {
            run_container_copy(src_1, dst);
            return;
        }
        if (if2) {
            run_container_copy(src_2, dst);
            return;
        }
    }
    const int32_t neededcapacity = src_1->n_runs + src_2->n_runs;
    if (dst->capacity < neededcapacity)
        run_container_grow(dst, neededcapacity, false);
    dst->n_runs = 0;
    int32_t rlepos = 0;
    int32_t xrlepos = 0;

    rle16_t previousrle;
    if (src_1->runs[rlepos].value <= src_2->runs[xrlepos].value) {
        previousrle = run_container_append_first(dst, src_1->runs[rlepos]);
        rlepos++;
    } else {
        previousrle = run_container_append_first(dst, src_2->runs[xrlepos]);
        xrlepos++;
    }

    while ((xrlepos < src_2->n_runs) && (rlepos < src_1->n_runs)) {
        rle16_t newrl;
        if (src_1->runs[rlepos].value <= src_2->runs[xrlepos].value) {
            newrl = src_1->runs[rlepos];
            rlepos++;
        } else {
            newrl = src_2->runs[xrlepos];
            xrlepos++;
        }
        run_container_append(dst, newrl, &previousrle);
    }
    while (xrlepos < src_2->n_runs) {
        run_container_append(dst, src_2->runs[xrlepos], &previousrle);
        xrlepos++;
    }
    while (rlepos < src_1->n_runs) {
        run_container_append(dst, src_1->runs[rlepos], &previousrle);
        rlepos++;
    }
}